

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.cpp
# Opt level: O0

int __thiscall sockpp::connector::connect(connector *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  bool bVar1;
  uint uVar2;
  socket_t __fd_00;
  socklen_t __len_00;
  uint uVar3;
  rep rVar4;
  sockaddr *__addr_00;
  error_code *peVar5;
  int *piVar6;
  error_category *ecat;
  undefined4 in_register_0000000c;
  connector *pcVar7;
  int ret;
  int ret_00;
  undefined4 in_register_00000034;
  socket *this_00;
  bool local_165;
  result<sockpp::none> *res_1;
  none local_139;
  undefined1 local_138 [24];
  undefined1 local_120 [24];
  error_category *local_108;
  undefined1 local_100 [16];
  error_category *local_f0;
  undefined1 local_e8 [16];
  result<sockpp::none> local_d8;
  int local_bc;
  error_category *peStack_b8;
  int err_1;
  undefined1 local_b0 [16];
  duration<long,_std::ratio<1L,_1000L>_> local_a0;
  int local_94;
  socket_t local_90;
  int ms;
  pollfd fds;
  error_condition local_78;
  undefined1 local_68 [8];
  error_code err;
  result<int> res;
  bool non_blocking;
  sock_address *addr_local;
  connector *this_local;
  microseconds timeout_local;
  
  this_00 = (socket *)CONCAT44(in_register_00000034,__fd);
  pcVar7 = (connector *)CONCAT44(in_register_0000000c,__len);
  this_local = pcVar7;
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)&this_local);
  if (rVar4 < 1) {
    connect(this,__fd,__addr,(socklen_t)pcVar7);
  }
  else {
    recreate((result<sockpp::none> *)this,(connector *)this_00,(sock_address *)__addr);
    bVar1 = sockpp::result::operator_cast_to_bool((result *)this);
    if (bVar1) {
      uVar2 = (*this_00->_vptr_socket[4])();
      if ((uVar2 & 1) == 0) {
        (*this_00->_vptr_socket[3])(&res.err_._M_cat,this_00,1);
      }
      __fd_00 = socket::handle(this_00);
      __addr_00 = (sockaddr *)(**(code **)(*(long *)__addr + 0x20))();
      __len_00 = (**(code **)(*(long *)__addr + 0x10))();
      uVar3 = ::connect(__fd_00,__addr_00,__len_00);
      socket::check_res<int,int>((result<int> *)&err._M_cat,(socket *)(ulong)uVar3,ret);
      bVar1 = sockpp::result::operator_cast_to_bool((result *)&err._M_cat);
      if (!bVar1) {
        peVar5 = result<int>::error((result<int> *)&err._M_cat);
        local_68._0_4_ = peVar5->_M_value;
        local_68._4_4_ = *(undefined4 *)&peVar5->field_0x4;
        err._0_8_ = peVar5->_M_cat;
        std::error_condition::error_condition<std::errc,void>(&local_78,operation_in_progress);
        bVar1 = std::operator==((error_code *)local_68,&local_78);
        local_165 = true;
        if (!bVar1) {
          std::error_condition::error_condition<std::errc,void>
                    ((error_condition *)&fds,operation_would_block);
          local_165 = std::operator==((error_code *)local_68,(error_condition *)&fds);
        }
        if (local_165 != false) {
          local_90 = socket::handle(this_00);
          ms._0_2_ = 5;
          ms._2_2_ = 0;
          local_a0.__r = (rep)std::chrono::
                              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000l>>
                                        ((duration<long,_std::ratio<1L,_1000000L>_> *)&this_local);
          rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_a0);
          local_94 = (int)rVar4;
          uVar3 = poll((pollfd *)&stack0xffffffffffffff70,1,local_94);
          socket::check_res<int,int>
                    ((result<int> *)&stack0xffffffffffffff48,(socket *)(ulong)uVar3,ret_00);
          err._M_cat = peStack_b8;
          res._0_8_ = local_b0._0_8_;
          res.err_._0_8_ = local_b0._8_8_;
          bVar1 = sockpp::result::operator_cast_to_bool((result *)&err._M_cat);
          if (bVar1) {
            bVar1 = sockpp::result::operator_cast_to_bool((result *)&err._M_cat);
            if ((bVar1) && (piVar6 = result<int>::value((result<int> *)&err._M_cat), 0 < *piVar6)) {
              socket::get_option<int>(&local_d8,this_00,1,4,&local_bc);
              bVar1 = sockpp::result::operator_cast_to_bool((result *)&local_d8);
              if (bVar1) {
                ecat = (error_category *)std::_V2::system_category();
                result<int>::from_error((result<int> *)&local_f0,local_bc,ecat);
                err._M_cat = local_f0;
                res._0_8_ = local_e8._0_8_;
                res.err_._0_8_ = local_e8._8_8_;
              }
            }
            else {
              result<int>::result((result<int> *)&local_108,timed_out);
              err._M_cat = local_108;
              res._0_8_ = local_100._0_8_;
              res.err_._0_8_ = local_100._8_8_;
            }
          }
        }
        bVar1 = sockpp::result::operator_cast_to_bool((result *)&err._M_cat);
        if (!bVar1) {
          (*this_00->_vptr_socket[5])(local_120);
          peVar5 = result<int>::error((result<int> *)&err._M_cat);
          result<sockpp::none>::result((result<sockpp::none> *)this,peVar5);
          goto LAB_0010e953;
        }
      }
      if ((uVar2 & 1) == 0) {
        (*this_00->_vptr_socket[3])(local_138,this_00,0);
      }
      result<sockpp::none>::result((result<sockpp::none> *)this,&local_139);
    }
  }
LAB_0010e953:
  return (int)this;
}

Assistant:

result<> connector::connect(const sock_address& addr, microseconds timeout) {
    if (timeout.count() <= 0)
        return connect(addr);

    if (auto res = recreate(addr); !res)
        return res;

    bool non_blocking =
#if defined(_WIN32)
        false;
#else
        is_non_blocking();
#endif

    if (!non_blocking)
        set_non_blocking(true);

    auto res = check_res(::connect(handle(), addr.sockaddr_ptr(), addr.size()));

    if (!res) {
        auto err = res.error();
        if (err == errc::operation_in_progress || err == errc::operation_would_block) {
// TODO: Windows has a WSAPoll() function we can use.
#if defined(_WIN32)
            // Non-blocking connect -- call `select` to wait until the timeout:
            // Note:  Windows returns errors in exceptset so check it too, the
            // logic afterwords doesn't change
            fd_set readset;
            FD_ZERO(&readset);
            FD_SET(handle(), &readset);
            fd_set writeset = readset;
            fd_set exceptset = readset;
            timeval tv = to_timeval(timeout);
            res =
                check_res(::select(int(handle()) + 1, &readset, &writeset, &exceptset, &tv));
#else
            pollfd fds = {handle(), POLLIN | POLLOUT, 0};
            int ms = int(duration_cast<milliseconds>(timeout).count());
            res = check_res(::poll(&fds, 1, ms));
#endif
            if (res) {
                if (res && res.value() > 0) {
                    // Got a socket event, but it might be an error, so check:
                    int err;
                    if (get_option(SOL_SOCKET, SO_ERROR, &err))
                        res = result<int>::from_error(err);
                }
                else {
                    res = errc::timed_out;
                }
            }
        }

        if (!res) {
            close();
            return res.error();
        }
    }

    // Restore blocking mode for socket, if needed.
    if (!non_blocking)
        set_non_blocking(false);

    return none{};
}